

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_tests.cpp
# Opt level: O3

void __thiscall
omp_in_container_in_stls_Test::~omp_in_container_in_stls_Test(omp_in_container_in_stls_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(omp_in, container_in_stls) {
  {
    const std::set<int> set_elements = {1, 42, 5};
    ASSERT_TRUE(omp::in(42, set_elements));
  }

  {
    const std::vector<int> vec_elements = {1, 42, 5};
    ASSERT_TRUE(omp::in(42, vec_elements));
  }

  {
    const std::list<int> list_elements = {1, 2, 6, 1};
    ASSERT_FALSE(omp::in(42, list_elements));
  }

  {
    const std::forward_list<int> fw_elements = {1, 2, 6, 1};
    ASSERT_FALSE(omp::in(42, fw_elements));
  }

  {
    const std::unordered_map<int, double> um_elements = {
        {1, 5.0}, {62, 25.5}, {11, 242}};
    ASSERT_FALSE(omp::in(42, um_elements));
  }
}